

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O3

void __thiscall Patch::Node::Node(Node *this,Deserializer *input)

{
  unique_ptr<Text,_std::default_delete<Text>_> *this_00;
  unique_ptr<Text,_std::default_delete<Text>_> *this_01;
  byte bVar1;
  _Head_base<0UL,_Text_*,_false> _Var2;
  byte *pbVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  pointer *__ptr;
  byte *pbVar7;
  _Head_base<0UL,_Text_*,_false> _Var8;
  pointer *__ptr_1;
  
  this->left = (Node *)0x0;
  this->right = (Node *)0x0;
  Point::Point(&this->old_extent,input);
  Point::Point(&this->new_extent,input);
  Point::Point(&this->old_distance_from_left_ancestor,input);
  Point::Point(&this->new_distance_from_left_ancestor,input);
  this_00 = &this->old_text;
  this_01 = &this->new_text;
  (this->old_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
  super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.super__Head_base<0UL,_Text_*,_false>.
  _M_head_impl = (Text *)0x0;
  (this->new_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
  super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.super__Head_base<0UL,_Text_*,_false>.
  _M_head_impl = (Text *)0x0;
  pbVar3 = *(byte **)input;
  if ((*(int *)(input + 8) - (int)pbVar3 & 0xfffffffcU) == 0) {
    *(byte **)input = pbVar3 + 4;
LAB_0016974d:
    _Var8._M_head_impl =
         (this_00->_M_t).super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
         super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
         super__Head_base<0UL,_Text_*,_false>._M_head_impl;
    (this_00->_M_t).super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
    super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.super__Head_base<0UL,_Text_*,_false>.
    _M_head_impl = (Text *)0x0;
    if (_Var8._M_head_impl != (Text *)0x0) {
      std::default_delete<Text>::operator()((default_delete<Text> *)this_00,_Var8._M_head_impl);
    }
    pbVar3 = *(byte **)input;
    iVar4 = (int)*(undefined8 *)(input + 8);
    if ((iVar4 - (int)pbVar3 & 0xfffffffcU) == 0) {
      uVar6 = 0;
    }
    else {
      iVar5 = 0;
      uVar6 = 0;
      pbVar7 = pbVar3;
      do {
        bVar1 = *pbVar7;
        pbVar7 = pbVar7 + 1;
        uVar6 = uVar6 | (uint)bVar1 << ((byte)iVar5 & 0x1f);
        iVar5 = iVar5 + 8;
      } while (iVar5 != 0x20);
    }
    pbVar3 = pbVar3 + 4;
    *(byte **)input = pbVar3;
    this->old_text_size_ = uVar6;
  }
  else {
    iVar4 = 0;
    uVar6 = 0;
    pbVar7 = pbVar3;
    do {
      bVar1 = *pbVar7;
      pbVar7 = pbVar7 + 1;
      uVar6 = uVar6 | (uint)bVar1 << ((byte)iVar4 & 0x1f);
      iVar4 = iVar4 + 8;
    } while (iVar4 != 0x20);
    *(byte **)input = pbVar3 + 4;
    if (uVar6 == 0) goto LAB_0016974d;
    _Var2._M_head_impl = (Text *)operator_new(0x38);
    Text::Text(_Var2._M_head_impl,input);
    _Var8._M_head_impl =
         (this_00->_M_t).super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
         super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
         super__Head_base<0UL,_Text_*,_false>._M_head_impl;
    (this_00->_M_t).super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
    super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.super__Head_base<0UL,_Text_*,_false>.
    _M_head_impl = _Var2._M_head_impl;
    if (_Var8._M_head_impl != (Text *)0x0) {
      std::default_delete<Text>::operator()((default_delete<Text> *)this_00,_Var8._M_head_impl);
    }
    this->old_text_size_ = 0;
    pbVar3 = *(byte **)input;
    iVar4 = (int)*(undefined8 *)(input + 8);
  }
  if ((iVar4 - (int)pbVar3 & 0xfffffffcU) == 0) {
    *(byte **)input = pbVar3 + 4;
  }
  else {
    iVar4 = 0;
    uVar6 = 0;
    pbVar7 = pbVar3;
    do {
      bVar1 = *pbVar7;
      pbVar7 = pbVar7 + 1;
      uVar6 = uVar6 | (uint)bVar1 << ((byte)iVar4 & 0x1f);
      iVar4 = iVar4 + 8;
    } while (iVar4 != 0x20);
    *(byte **)input = pbVar3 + 4;
    if (uVar6 != 0) {
      _Var2._M_head_impl = (Text *)operator_new(0x38);
      Text::Text(_Var2._M_head_impl,input);
      _Var8._M_head_impl =
           (this_01->_M_t).super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
           super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
           super__Head_base<0UL,_Text_*,_false>._M_head_impl;
      (this_01->_M_t).super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
      super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
      super__Head_base<0UL,_Text_*,_false>._M_head_impl = _Var2._M_head_impl;
      goto LAB_00169802;
    }
  }
  _Var8._M_head_impl =
       (this_01->_M_t).super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
       super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
       super__Head_base<0UL,_Text_*,_false>._M_head_impl;
  (this_01->_M_t).super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
  super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.super__Head_base<0UL,_Text_*,_false>.
  _M_head_impl = (Text *)0x0;
LAB_00169802:
  if (_Var8._M_head_impl == (Text *)0x0) {
    return;
  }
  std::default_delete<Text>::operator()((default_delete<Text> *)this_01,_Var8._M_head_impl);
  return;
}

Assistant:

Node(Deserializer &input) :
    left{nullptr},
    right{nullptr},
    old_extent{input},
    new_extent{input},
    old_distance_from_left_ancestor{input},
    new_distance_from_left_ancestor{input} {

    if (input.read<uint32_t>()) {
      old_text = unique_ptr<Text>{new Text{input}};
      old_text_size_ = 0;
    } else {
      old_text = nullptr;
      old_text_size_ = input.read<uint32_t>();
    }

    if (input.read<uint32_t>()) {
      new_text = unique_ptr<Text>{new Text{input}};
    } else {
      new_text = nullptr;
    }
  }